

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O1

void __thiscall
Logger::StructuredFileOutputSink::gotMessage
          (StructuredFileOutputSink *this,char *message,uint flags)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  time_t tVar4;
  FILE *__stream;
  ScopedLock scope;
  FastString fileName;
  String local_60;
  undefined4 local_50 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar2 = (**(this->super_OutputSink)._vptr_OutputSink)(this,(ulong)flags);
  if (((char)iVar2 != '\0') && (this->file != (FILE *)0x0)) {
    tVar4 = time((time_t *)0x0);
    Threading::FastLock::_Lock(&this->lock,(TimeOut *)&Threading::Infinite);
    bVar1 = Bstrlib::String::operator==(&this->lastMessage,message);
    if (bVar1 && this->lastFlags == flags) {
      this->lastMessageCount = this->lastMessageCount + 1;
    }
    else {
      flushLastMessage(this);
      iVar2 = this->currentSize + (this->lastMessage).super_tagbstring.slen;
      this->currentSize = iVar2;
      if (this->breakSize <= iVar2) {
        Bstrlib::String::operator+(&local_60,(char *)&this->baseFileName);
        __stream = fopen((char *)local_60.super_tagbstring.data,"wb");
        if (__stream != (FILE *)0x0) {
          local_48 = 0;
          uStack_40 = 0;
          local_50[0] = 1;
          iVar2 = fileno(__stream);
          fcntl(iVar2,6,local_50);
          iVar2 = fileno(__stream);
          uVar3 = fcntl(iVar2,1);
          iVar2 = fileno(__stream);
          fcntl(iVar2,2,(ulong)(uVar3 | 1));
          fclose((FILE *)this->file);
          this->file = (FILE *)__stream;
        }
        this->flipFlop = (bool)(this->flipFlop ^ 1);
        this->currentSize = 0;
        Bstrlib::String::~String(&local_60);
      }
      Bstrlib::String::operator=(&this->lastMessage,message);
      this->lastFlags = flags;
      this->lastMessageCount = 1;
      this->lastTime = (uint32)tVar4;
    }
    Threading::FastLock::_Unlock(&this->lock,(void *)0x0);
  }
  return;
}

Assistant:

void StructuredFileOutputSink::gotMessage(const char * message, const unsigned int flags)
    {
        if (!checkFlags(flags) || file == 0) return;
        // Need to structure the file
        // Find out the time
        time_t now = time(NULL);
        // Don't allow 64 bits time
        uint32 nowTime = (uint32)now;

        Threading::ScopedLock scope(lock);
        if (lastMessage == message && lastFlags == flags)
        {
            lastMessageCount++;
            return;
        }
        flushLastMessage();

        // Split the log file if required
        currentSize += lastMessage.getLength();
        if (currentSize >= breakSize)
        {
            Strings::FastString fileName = baseFileName + (flipFlop ? ".1" : ".0");
#ifdef _WIN32
            FILE * newFile = _fsopen(fileName, "wb", _SH_DENYWR);
#elif defined(_POSIX)
            FILE * newFile = fopen(fileName, "wb");
            if (newFile)
            {
                struct flock fl;
                fl.l_whence = SEEK_SET;
                fl.l_start = 0; fl.l_len = 0; fl.l_type = F_WRLCK;
                fcntl(fileno(newFile), F_SETLK, &fl);

                // Prevent any child process from inheriting the file on forking
                int flags = fcntl(fileno(newFile), F_GETFD);
                flags |= FD_CLOEXEC;
                fcntl(fileno(newFile), F_SETFD, flags);
                fclose(file);
                file = newFile;
            }
#endif
            flipFlop = !flipFlop;
            currentSize = 0;
        }
        lastMessage = message;
        lastFlags = flags;
        lastMessageCount = 1;
        lastTime = nowTime;
    }